

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O2

char * vis(char *mbdst,wchar_t c,wchar_t flags,wchar_t nextc)

{
  wchar_t wVar1;
  char *pcVar2;
  char cc [2];
  char *mbdst_local;
  
  cc[0] = (char)c;
  cc[1] = (char)nextc;
  mbdst_local = mbdst;
  wVar1 = istrsenvisx(&mbdst_local,(size_t *)0x0,cc,1,flags,"",(wchar_t *)0x0);
  pcVar2 = mbdst_local + (uint)wVar1;
  if (wVar1 < L'\0') {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *
vis(char *mbdst, int c, int flags, int nextc)
{
	char cc[2];
	int ret;

	cc[0] = c;
	cc[1] = nextc;

	ret = istrsenvisx(&mbdst, NULL, cc, 1, flags, "", NULL);
	if (ret < 0)
		return NULL;
	return mbdst + ret;
}